

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inlined_vector.h
# Opt level: O0

InlinedVector<S2ClosestPointQueryBase<S2MinDistance,_int>::QueueEntry,_16UL,_std::allocator<S2ClosestPointQueryBase<S2MinDistance,_int>::QueueEntry>_>
* __thiscall
absl::
InlinedVector<S2ClosestPointQueryBase<S2MinDistance,_int>::QueueEntry,_16UL,_std::allocator<S2ClosestPointQueryBase<S2MinDistance,_int>::QueueEntry>_>
::operator=(InlinedVector<S2ClosestPointQueryBase<S2MinDistance,_int>::QueueEntry,_16UL,_std::allocator<S2ClosestPointQueryBase<S2MinDistance,_int>::QueueEntry>_>
            *this,InlinedVector<S2ClosestPointQueryBase<S2MinDistance,_int>::QueueEntry,_16UL,_std::allocator<S2ClosestPointQueryBase<S2MinDistance,_int>::QueueEntry>_>
                  *other)

{
  bool bVar1;
  Allocation *allocation;
  size_type sVar2;
  size_type sVar3;
  iterator pQVar4;
  move_iterator<S2ClosestPointQueryBase<S2MinDistance,_int>::QueueEntry_*> mVar5;
  move_iterator<S2ClosestPointQueryBase<S2MinDistance,_int>::QueueEntry_*> mVar6;
  QueueEntry *from;
  Tag *pTVar7;
  QueueEntry *new_end;
  move_iterator<S2ClosestPointQueryBase<S2MinDistance,_int>::QueueEntry_*> mid;
  InlinedVector<S2ClosestPointQueryBase<S2MinDistance,_int>::QueueEntry,_16UL,_std::allocator<S2ClosestPointQueryBase<S2MinDistance,_int>::QueueEntry>_>
  *other_local;
  InlinedVector<S2ClosestPointQueryBase<S2MinDistance,_int>::QueueEntry,_16UL,_std::allocator<S2ClosestPointQueryBase<S2MinDistance,_int>::QueueEntry>_>
  *this_local;
  
  if (this != other) {
    bVar1 = allocated(other);
    if (bVar1) {
      clear(this);
      pTVar7 = tag(this);
      sVar2 = size(other);
      Tag::set_allocated_size(pTVar7,sVar2);
      allocation = InlinedVector<S2ClosestPointQueryBase<S2MinDistance,_int>::QueueEntry,_16UL,_std::allocator<S2ClosestPointQueryBase<S2MinDistance,_int>::QueueEntry>_>
                   ::allocation(other);
      init_allocation(this,allocation);
      Tag::Tag((Tag *)&mid);
      pTVar7 = tag(other);
      pTVar7->size_ = (size_type)mid._M_current;
    }
    else {
      bVar1 = allocated(this);
      if (bVar1) {
        clear(this);
      }
      sVar2 = size(this);
      sVar3 = size(other);
      if (sVar2 < sVar3) {
        pQVar4 = begin(other);
        sVar2 = size(this);
        mVar5 = std::make_move_iterator<S2ClosestPointQueryBase<S2MinDistance,int>::QueueEntry*>
                          (pQVar4 + sVar2);
        pQVar4 = begin(other);
        mVar6 = std::make_move_iterator<S2ClosestPointQueryBase<S2MinDistance,int>::QueueEntry*>
                          (pQVar4);
        pQVar4 = begin(this);
        std::
        copy<std::move_iterator<S2ClosestPointQueryBase<S2MinDistance,int>::QueueEntry*>,S2ClosestPointQueryBase<S2MinDistance,int>::QueueEntry*>
                  (mVar6,mVar5,pQVar4);
        pQVar4 = end(other);
        mVar6 = std::make_move_iterator<S2ClosestPointQueryBase<S2MinDistance,int>::QueueEntry*>
                          (pQVar4);
        pQVar4 = end(this);
        InlinedVector<S2ClosestPointQueryBase<S2MinDistance,int>::QueueEntry,16ul,std::allocator<S2ClosestPointQueryBase<S2MinDistance,int>::QueueEntry>>
        ::
        UninitializedCopy<std::move_iterator<S2ClosestPointQueryBase<S2MinDistance,int>::QueueEntry*>>
                  ((InlinedVector<S2ClosestPointQueryBase<S2MinDistance,int>::QueueEntry,16ul,std::allocator<S2ClosestPointQueryBase<S2MinDistance,int>::QueueEntry>>
                    *)this,mVar5,mVar6,pQVar4);
      }
      else {
        pQVar4 = begin(other);
        mVar5 = std::make_move_iterator<S2ClosestPointQueryBase<S2MinDistance,int>::QueueEntry*>
                          (pQVar4);
        pQVar4 = end(other);
        mVar6 = std::make_move_iterator<S2ClosestPointQueryBase<S2MinDistance,int>::QueueEntry*>
                          (pQVar4);
        pQVar4 = begin(this);
        from = std::
               copy<std::move_iterator<S2ClosestPointQueryBase<S2MinDistance,int>::QueueEntry*>,S2ClosestPointQueryBase<S2MinDistance,int>::QueueEntry*>
                         (mVar5,mVar6,pQVar4);
        pQVar4 = end(this);
        Destroy(this,from,pQVar4);
      }
      pTVar7 = tag(this);
      sVar2 = size(other);
      Tag::set_inline_size(pTVar7,sVar2);
    }
  }
  return this;
}

Assistant:

InlinedVector& operator=(InlinedVector&& other) {
    if (ABSL_PREDICT_FALSE(this == &other)) return *this;

    if (other.allocated()) {
      clear();
      tag().set_allocated_size(other.size());
      init_allocation(other.allocation());
      other.tag() = Tag();
    } else {
      if (allocated()) clear();
      // Both are inlined now.
      if (size() < other.size()) {
        auto mid = std::make_move_iterator(other.begin() + size());
        std::copy(std::make_move_iterator(other.begin()), mid, begin());
        UninitializedCopy(mid, std::make_move_iterator(other.end()), end());
      } else {
        auto new_end = std::copy(std::make_move_iterator(other.begin()),
                                 std::make_move_iterator(other.end()), begin());
        Destroy(new_end, end());
      }
      tag().set_inline_size(other.size());
    }
    return *this;
  }